

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsgRuleLocalPolynomial.hpp
# Opt level: O2

double TasGrid::RuleLocal::diffSupport<(TasGrid::RuleLocal::erule)3>
                 (int max_order,int point,double x,bool *isSupported)

{
  double dVar1;
  double dVar2;
  
  dVar1 = scaleX<(TasGrid::RuleLocal::erule)3>(point,x);
  if ((dVar1 < -1.0) || (1.0 <= dVar1)) {
    *isSupported = x == 1.0 && dVar1 == 1.0;
    if (x != 1.0 || dVar1 != 1.0) {
      return 0.0;
    }
  }
  else {
    *isSupported = true;
  }
  dVar2 = scaleDiffX<(TasGrid::RuleLocal::erule)3>(point);
  if (max_order == 3) {
    dVar1 = diffPWCubic<(TasGrid::RuleLocal::erule)3>(point,dVar1);
  }
  else {
    if (max_order == 2) {
      return dVar1 * -2.0 * dVar2;
    }
    if (max_order == 1) {
      if (((point == 0) && (x == 1.0)) && (!NAN(x))) {
        return -1.0;
      }
      return (double)(~-(ulong)(0.0 <= dVar1) & (ulong)dVar2 |
                     (ulong)-dVar2 & -(ulong)(0.0 <= dVar1));
    }
    dVar1 = diffPWPower<(TasGrid::RuleLocal::erule)3>(max_order,point,dVar1);
  }
  return dVar2 * dVar1;
}

Assistant:

double diffSupport(int max_order, int point, double x, bool &isSupported) {
        switch(effrule) {
            case erule::pwc:
                isSupported = false;
                return 0.0;
            case erule::localp: {
                if (point == 0) { isSupported = true; return 0.0; }
                double xn = scaleX<effrule>(point, x);
                isSupported = (-1.0 <= xn and xn < 1.0) or (x == 1.0 and xn == 1.0);
                if (isSupported) {
                    double an = scaleDiffX<effrule>(point);
                    switch(max_order) {
                        case 1: return (x == 1.0 and point == 2) ? an : (((xn >= 0 ? -1.0 : 1.0) * an));
                        case 2: return an * diffPWQuadratic<effrule>(point, xn);
                        case 3: return an * diffPWCubic<effrule>(point, xn);
                        default:
                            return an * diffPWPower<effrule>(max_order, point, xn);
                    };
                } else {
                    return 0.0;
                }
            }
            case erule::semilocalp:
                switch(point) {
                    case 0: { isSupported = true; return 0.0; }
                    case 1: { isSupported = true; return x - 0.5; }
                    case 2: { isSupported = true; return x + 0.5; }
                    default: {
                        double xn = scaleX<effrule>(point, x);
                        isSupported = (-1.0 <= xn and xn < 1.0) or (x == 1.0 and xn == 1.0);
                        if (isSupported) {
                            double an = scaleDiffX<effrule>(point);
                            switch(max_order) {
                                case 2: return an * diffPWQuadratic<effrule>(point, xn);
                                case 3: return an * diffPWCubic<effrule>(point, xn);
                                default:
                                    return an * diffPWPower<effrule>(max_order, point, xn);
                            };
                        } else {
                            return 0.0;
                        }
                    }
                };
            case erule::localp0: {
                double xn = scaleX<effrule>(point, x);
                isSupported = (-1.0 <= xn and xn < 1.0) or (x == 1.0 and xn == 1.0);
                if (isSupported) {
                    double an = scaleDiffX<effrule>(point);
                    switch(max_order) {
                        case 1: return (x == 1.0 and point == 0) ? -1.0 : ((xn >= 0 ? -1.0 : 1.0) * an);
                        case 2: return an * diffPWQuadratic<effrule>(point, xn);
                        case 3: return an * diffPWCubic<effrule>(point, xn);
                        default:
                            return an * diffPWPower<effrule>(max_order, point, xn);
                    };
                } else {
                    return 0.0;
                }
            }
            default: { // case erule::localpb:
                double xn = scaleX<effrule>(point, x);
                isSupported = (-1.0 <= xn and xn < 1.0) or (x == 1.0 and xn == 1.0);
                if (isSupported) {
                    double an = scaleDiffX<effrule>(point);
                    switch(max_order) {
                        case 1: return ((xn >= 0 ? -1.0 : 1.0) * an);
                        case 2: return an * diffPWQuadratic<effrule>(point, xn);
                        case 3: return an * diffPWCubic<effrule>(point, xn);
                        default:
                            return an * diffPWPower<effrule>(max_order, point, xn);
                    };
                } else {
                    return 0.0;
                }
            }
        };
    }